

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraylist.c
# Opt level: O1

array_list * array_list_new2(array_list_free_fn *free_fn,int initial_size)

{
  array_list *__ptr;
  void **ppvVar1;
  
  if ((-1 < initial_size) && (__ptr = (array_list *)malloc(0x20), __ptr != (array_list *)0x0)) {
    __ptr->size = (long)initial_size;
    __ptr->length = 0;
    __ptr->free_fn = free_fn;
    ppvVar1 = (void **)malloc((long)initial_size << 3);
    __ptr->array = ppvVar1;
    if (ppvVar1 != (void **)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (array_list *)0x0;
}

Assistant:

struct array_list *array_list_new2(array_list_free_fn *free_fn, int initial_size)
{
	struct array_list *arr;

	if (initial_size < 0 || (size_t)initial_size >= SIZE_T_MAX / sizeof(void *))
		return NULL;
	arr = (struct array_list *)malloc(sizeof(struct array_list));
	if (!arr)
		return NULL;
	arr->size = initial_size;
	arr->length = 0;
	arr->free_fn = free_fn;
	if (!(arr->array = (void **)malloc(arr->size * sizeof(void *))))
	{
		free(arr);
		return NULL;
	}
	return arr;
}